

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,char *value)

{
  bool bVar1;
  CacheEntryType CVar2;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    __s = "STRING";
    if (value != (char *)0x0) {
      __s = value;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
    CVar2 = cmState::StringToCacheEntryType(&local_38);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  bVar1 = std::operator==(prop,"VALUE");
  if (bVar1) {
    std::__cxx11::string::assign((char *)this);
    return;
  }
  cmPropertyMap::SetProperty(&this->Properties,prop,value);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const char* value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    this->Value = value ? value : "";
  } else {
    this->Properties.SetProperty(prop, value);
  }
}